

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

EntryType * __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::FindEntry(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
            *this,JavascriptPromise *key)

{
  uint targetBucket;
  EntryType *pEVar1;
  
  targetBucket = HashKeyToBucket(this,key);
  pEVar1 = FindEntry(this,key,targetBucket);
  return pEVar1;
}

Assistant:

EntryType * FindEntry(TKey key)
    {
        uint targetBucket = HashKeyToBucket(key);
        return FindEntry(key, targetBucket);
    }